

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  ulong *puVar1;
  int pos;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)id;
  uVar4 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  puVar1 = (this->contained_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar4 >> 6) +
           (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << (uVar3 & 0x3f);
  pos = this->heap_end;
  this->heap_end = pos + 1;
  piVar2 = (this->heap).
           super__Vector_base<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2[pos].id = id;
  piVar2[pos].key = key;
  (this->id_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar3] = pos;
  move_up(this,pos);
  return;
}

Assistant:

void push(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");
        assert(!contains(id) && "can not push an already existing id");

        contained_flags[id] = true;

        int new_pos = heap_end;
        ++heap_end;
        heap[new_pos].id = id;
        heap[new_pos].key = std::move(key);
        id_pos[id] = new_pos;
        move_up(new_pos);

        check_id_invariants();
        check_order_invariants();
    }